

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,void>
               (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  char *elem;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
  *container_local;
  
  std::operator<<(os,'{');
  __range3 = (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)0x0;
  __end0 = std::__cxx11::
           basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
           begin(container);
  elem = (char *)std::__cxx11::
                 basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 ::end(container);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                      (&__end0,(__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_004c3297:
      if (__range3 !=
          (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *)
          0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
            ::operator*(&__end0);
    if ((__range3 !=
         (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *)
         0x0) && (std::operator<<(os,','),
                 __range3 ==
                 (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_004c3297;
    }
    std::operator<<(os,' ');
    UniversalPrint<signed_char>(value,os);
    __range3 = (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *)((long)&(__range3->_M_dataplus)._M_p + 1);
    __gnu_cxx::
    __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }